

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_pfx.cpp
# Opt level: O2

void Convert32(BYTE *src,int srcpitch,void *destin,int destpitch,int destwidth,int destheight,
              fixed_t xstep,fixed_t ystep,fixed_t xfrac,fixed_t yfrac)

{
  uint uVar1;
  long lVar2;
  fixed_t fVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  
  if (destheight != 0 || destwidth != 0) {
    if (ystep == 0x10000 && xstep == 0x10000) {
      while (bVar8 = destheight != 0, destheight = destheight + -1, iVar4 = destwidth >> 3, bVar8) {
        while (iVar4 != 0) {
          *(DWORD *)destin = GPfxPal.Pal32[*src];
          *(DWORD *)((long)destin + 4) = GPfxPal.Pal32[src[1]];
          *(DWORD *)((long)destin + 8) = GPfxPal.Pal32[src[2]];
          *(DWORD *)((long)destin + 0xc) = GPfxPal.Pal32[src[3]];
          *(DWORD *)((long)destin + 0x10) = GPfxPal.Pal32[src[4]];
          *(DWORD *)((long)destin + 0x14) = GPfxPal.Pal32[src[5]];
          *(DWORD *)((long)destin + 0x18) = GPfxPal.Pal32[src[6]];
          *(DWORD *)((long)destin + 0x1c) = GPfxPal.Pal32[src[7]];
          destin = (void *)((long)destin + 0x20);
          src = src + 8;
          iVar4 = iVar4 + -1;
        }
        lVar2 = (long)destwidth - (long)srcpitch;
        lVar6 = (long)destwidth * 4 + (long)(destpitch >> 2) * -4;
        for (lVar7 = 0; (destwidth & 7U) != (uint)lVar7; lVar7 = lVar7 + 1) {
          *(DWORD *)((long)destin + lVar7 * 4) = GPfxPal.Pal32[src[lVar7]];
          lVar2 = lVar2 + -1;
          lVar6 = lVar6 + -4;
        }
        destin = (void *)((long)destin - lVar6);
        src = src + -lVar2;
      }
    }
    else {
      while (bVar8 = destheight != 0, destheight = destheight + -1, bVar8) {
        lVar2 = 0;
        fVar3 = xfrac;
        for (lVar6 = 0; destwidth >> 1 != (int)lVar6; lVar6 = lVar6 + 1) {
          *(DWORD *)((long)destin + lVar6 * 8) = GPfxPal.Pal32[src[fVar3 >> 0x10]];
          *(DWORD *)((long)destin + lVar6 * 8 + 4) = GPfxPal.Pal32[src[fVar3 + xstep >> 0x10]];
          fVar3 = fVar3 + xstep + xstep;
          lVar2 = lVar2 + -8;
        }
        if ((destwidth & 1U) == 0) {
          lVar2 = -lVar2;
        }
        else {
          *(DWORD *)((long)destin + lVar6 * 8) = GPfxPal.Pal32[src[fVar3 >> 0x10]];
          lVar2 = 4 - lVar2;
        }
        iVar5 = yfrac + ystep;
        iVar4 = 0xffff;
        if (iVar5 < 0xffff) {
          iVar4 = iVar5;
        }
        uVar1 = (ystep + 0xffff + yfrac) - iVar4;
        src = src + (ulong)(uVar1 >> 0x10) * (long)srcpitch;
        yfrac = iVar5 - (uVar1 & 0xffff0000);
        destin = (void *)((long)destin + (long)((destpitch >> 2) - destwidth) * 4 + lVar2);
      }
    }
  }
  return;
}

Assistant:

static void Convert32 (BYTE *src, int srcpitch,
	void *destin, int destpitch, int destwidth, int destheight,
	fixed_t xstep, fixed_t ystep, fixed_t xfrac, fixed_t yfrac)
{
	if ((destwidth | destheight) == 0)
	{
		return;
	}

	int x, y, savedx;
	DWORD *dest = (DWORD *)destin;

	destpitch = (destpitch >> 2) - destwidth;
	if (xstep == FRACUNIT && ystep == FRACUNIT)
	{
		srcpitch -= destwidth;
		for (y = destheight; y != 0; y--)
		{
			for (savedx = x = destwidth, x >>= 3; x != 0; x--)
			{
				dest[0] = GPfxPal.Pal32[src[0]];
				dest[1] = GPfxPal.Pal32[src[1]];
				dest[2] = GPfxPal.Pal32[src[2]];
				dest[3] = GPfxPal.Pal32[src[3]];
				dest[4] = GPfxPal.Pal32[src[4]];
				dest[5] = GPfxPal.Pal32[src[5]];
				dest[6] = GPfxPal.Pal32[src[6]];
				dest[7] = GPfxPal.Pal32[src[7]];
				dest += 8;
				src += 8;
			}
			for (x = savedx & 7; x != 0; x--)
			{
				*dest++ = GPfxPal.Pal32[*src++];
			}
			dest += destpitch;
			src += srcpitch;
		}
	}
	else
	{
		for (y = destheight; y != 0; y--)
		{
			fixed_t xf = xfrac;
			for (savedx = x = destwidth, x >>= 1; x != 0; x--)
			{
				dest[0] = GPfxPal.Pal32[src[xf >> FRACBITS]];		xf += xstep;
				dest[1] = GPfxPal.Pal32[src[xf >> FRACBITS]];		xf += xstep;
				dest += 2;
			}
			if (savedx & 1)
			{
				*dest++ = GPfxPal.Pal32[src[xf >> FRACBITS]];
			}
			yfrac += ystep;
			while (yfrac >= FRACUNIT)
			{
				yfrac -= FRACUNIT;
				src += srcpitch;
			}
			dest += destpitch;
		}
	}
}